

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_clip.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdClipRect::emulate_mthd(MthdClipRect *this)

{
  uint uVar1;
  uint32_t uVar2;
  int n;
  MthdClipRect *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type < 3) {
    uVar2 = pgraph_class(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    if (uVar2 == 0x10) {
      uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0];
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xfeffffff;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xefffffff |
           (uint)(-1 < (long)((ulong)uVar1 << 0x27)) << 0x1c;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_1[0] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_1[0] & 0x3000331;
      nv01_pgraph_vtx_fixup
                (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0,2,
                 (this->super_SingleMthdTest).super_MthdTest.val & 0xffff,1,0,2);
      nv01_pgraph_vtx_fixup
                (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,1,2,
                 (this->super_SingleMthdTest).super_MthdTest.val >> 0x10,1,0,2);
      nv01_pgraph_vtx_fixup
                (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0,3,
                 (this->super_SingleMthdTest).super_MthdTest.val & 0xffff,1,1,3);
      nv01_pgraph_vtx_fixup
                (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,1,3,
                 (this->super_SingleMthdTest).super_MthdTest.val >> 0x10,1,1,3);
      pgraph_prep_draw(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,false,false)
      ;
    }
    else {
      nv01_pgraph_set_clip
                (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,1,
                 (this->super_SingleMthdTest).super_MthdTest.val);
    }
  }
  else if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
           chipset.card_type < 4) {
    nv03_pgraph_set_clip
              (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,this->which_clip,2,
               (this->super_SingleMthdTest).super_MthdTest.val,
               (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                             xy_misc_1[0] << 0x3f) < 0);
  }
  else {
    nv04_pgraph_set_clip
              (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,this->which_clip,2,
               (this->super_SingleMthdTest).super_MthdTest.val);
  }
  return;
}

Assistant:

void MthdClipRect::emulate_mthd() {
	if (chipset.card_type < 3) {
		if (pgraph_class(&exp) == 0x10) {
			int n = extr(exp.valid[0], 24, 1);
			insrt(exp.valid[0], 24, 1, 0);
			insrt(exp.valid[0], 28, 1, !n);
			exp.xy_misc_1[0] &= 0x03000331;
			nv01_pgraph_vtx_fixup(&exp, 0, 2, extr(val, 0, 16), 1, 0, 2);
			nv01_pgraph_vtx_fixup(&exp, 1, 2, extr(val, 16, 16), 1, 0, 2);
			nv01_pgraph_vtx_fixup(&exp, 0, 3, extr(val, 0, 16), 1, 1, 3);
			nv01_pgraph_vtx_fixup(&exp, 1, 3, extr(val, 16, 16), 1, 1, 3);
			pgraph_prep_draw(&exp, false, false);
		} else {
			nv01_pgraph_set_clip(&exp, 1, val);
		}
	} else if (chipset.card_type < 4) {
		nv03_pgraph_set_clip(&exp, which_clip, 2, val, extr(orig.xy_misc_1[0], 0, 1));
	} else {
		nv04_pgraph_set_clip(&exp, which_clip, 2, val);
	}
}